

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Type.cpp
# Opt level: O2

uint64_t __thiscall soul::Type::getPackedSizeInBytes(Type *this)

{
  Category CVar1;
  ArraySize AVar2;
  Structure *this_00;
  uint64_t uVar3;
  uint64_t uStack_30;
  Type TStack_28;
  
  CVar1 = this->category;
  if (CVar1 == vector) {
    uStack_30 = PrimitiveType::getPackedSizeInBytes(&this->primitiveType);
    AVar2 = getVectorSize(this);
    uStack_30 = AVar2 * uStack_30;
  }
  else if ((CVar1 == array) && (this->boundingSize == 0)) {
    uStack_30 = 8;
  }
  else if (CVar1 == array) {
    getArrayElementType(&TStack_28,this);
    uStack_30 = getPackedSizeInBytes(&TStack_28);
    AVar2 = getArraySize(this);
    uStack_30 = AVar2 * uStack_30;
    RefCountedPtr<soul::Structure>::~RefCountedPtr(&TStack_28.structure);
  }
  else {
    if (CVar1 != stringLiteral) {
      if (CVar1 != structure) {
        uVar3 = PrimitiveType::getPackedSizeInBytes(&this->primitiveType);
        return uVar3;
      }
      this_00 = RefCountedPtr<soul::Structure>::operator->(&this->structure);
      uVar3 = Structure::getPackedSizeInBytes(this_00);
      return uVar3;
    }
    uStack_30 = 4;
  }
  return uStack_30;
}

Assistant:

uint64_t Type::getPackedSizeInBytes() const
{
    if (isVector())         return primitiveType.getPackedSizeInBytes() * static_cast<uint64_t> (getVectorSize());
    if (isUnsizedArray())   return sizeof (void*);
    if (isArray())          return getArrayElementType().getPackedSizeInBytes() * static_cast<uint64_t> (getArraySize());
    if (isStruct())         return structure->getPackedSizeInBytes();
    if (isStringLiteral())  return sizeof (StringDictionary::Handle);

    return primitiveType.getPackedSizeInBytes();
}